

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_ssse3.c
# Opt level: O2

uint masked_sad_ssse3(uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,int a_stride,uint8_t *b_ptr,
                     int b_stride,uint8_t *m_ptr,int m_stride,int width,int height)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  short sVar6;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar7 [16];
  short sVar14;
  short sVar15;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  undefined1 auVar16 [16];
  undefined1 auVar24 [16];
  short sVar32;
  undefined1 auVar25 [16];
  undefined1 auVar33 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  iVar2 = 0;
  if (height < 1) {
    height = 0;
  }
  iVar4 = 0;
  iVar5 = 0;
  for (; iVar2 != height; iVar2 = iVar2 + 1) {
    for (lVar3 = 0; lVar3 < width; lVar3 = lVar3 + 0x10) {
      auVar7 = *(undefined1 (*) [16])(a_ptr + lVar3);
      puVar1 = b_ptr + lVar3;
      auVar25 = *(undefined1 (*) [16])(m_ptr + lVar3);
      auVar23._0_14_ = auVar7._0_14_;
      auVar23[0xe] = auVar7[7];
      auVar23[0xf] = puVar1[7];
      auVar22._14_2_ = auVar23._14_2_;
      auVar22._0_13_ = auVar7._0_13_;
      auVar22[0xd] = puVar1[6];
      auVar21._13_3_ = auVar22._13_3_;
      auVar21._0_12_ = auVar7._0_12_;
      auVar21[0xc] = auVar7[6];
      auVar20._12_4_ = auVar21._12_4_;
      auVar20._0_11_ = auVar7._0_11_;
      auVar20[0xb] = puVar1[5];
      auVar19._11_5_ = auVar20._11_5_;
      auVar19._0_10_ = auVar7._0_10_;
      auVar19[10] = auVar7[5];
      auVar18._10_6_ = auVar19._10_6_;
      auVar18._0_9_ = auVar7._0_9_;
      auVar18[9] = puVar1[4];
      auVar17._9_7_ = auVar18._9_7_;
      auVar17._0_8_ = auVar7._0_8_;
      auVar17[8] = auVar7[4];
      auVar16._8_8_ = auVar17._8_8_;
      auVar16[7] = puVar1[3];
      auVar16[6] = auVar7[3];
      auVar16[5] = puVar1[2];
      auVar16[4] = auVar7[2];
      auVar16[3] = puVar1[1];
      auVar16[2] = auVar7[1];
      auVar16[0] = auVar7[0];
      auVar16[1] = *puVar1;
      auVar40._0_14_ = auVar25._0_14_;
      auVar40[0xe] = auVar25[7];
      auVar40[0xf] = '@' - auVar25[7];
      auVar39._14_2_ = auVar40._14_2_;
      auVar39._0_13_ = auVar25._0_13_;
      auVar39[0xd] = '@' - auVar25[6];
      auVar38._13_3_ = auVar39._13_3_;
      auVar38._0_12_ = auVar25._0_12_;
      auVar38[0xc] = auVar25[6];
      auVar37._12_4_ = auVar38._12_4_;
      auVar37._0_11_ = auVar25._0_11_;
      auVar37[0xb] = '@' - auVar25[5];
      auVar36._11_5_ = auVar37._11_5_;
      auVar36._0_10_ = auVar25._0_10_;
      auVar36[10] = auVar25[5];
      auVar35._10_6_ = auVar36._10_6_;
      auVar35._0_9_ = auVar25._0_9_;
      auVar35[9] = '@' - auVar25[4];
      auVar34._9_7_ = auVar35._9_7_;
      auVar34._0_8_ = auVar25._0_8_;
      auVar34[8] = auVar25[4];
      auVar33._8_8_ = auVar34._8_8_;
      auVar33[7] = '@' - auVar25[3];
      auVar33[6] = auVar25[3];
      auVar33[5] = '@' - auVar25[2];
      auVar33[4] = auVar25[2];
      auVar33[3] = '@' - auVar25[1];
      auVar33[2] = auVar25[1];
      auVar33[1] = '@' - auVar25[0];
      auVar33[0] = auVar25[0];
      auVar24 = pmaddubsw(auVar16,auVar33);
      sVar15 = pavgw(auVar24._0_2_ >> 5,0);
      sVar26 = pavgw(auVar24._2_2_ >> 5,0);
      sVar27 = pavgw(auVar24._4_2_ >> 5,0);
      sVar28 = pavgw(auVar24._6_2_ >> 5,0);
      sVar29 = pavgw(auVar24._8_2_ >> 5,0);
      sVar30 = pavgw(auVar24._10_2_ >> 5,0);
      sVar31 = pavgw(auVar24._12_2_ >> 5,0);
      sVar32 = pavgw(auVar24._14_2_ >> 5,0);
      auVar24[1] = puVar1[8];
      auVar24[0] = auVar7[8];
      auVar24[2] = auVar7[9];
      auVar24[3] = puVar1[9];
      auVar24[4] = auVar7[10];
      auVar24[5] = puVar1[10];
      auVar24[6] = auVar7[0xb];
      auVar24[7] = puVar1[0xb];
      auVar24[8] = auVar7[0xc];
      auVar24[9] = puVar1[0xc];
      auVar24[10] = auVar7[0xd];
      auVar24[0xb] = puVar1[0xd];
      auVar24[0xc] = auVar7[0xe];
      auVar24[0xd] = puVar1[0xe];
      auVar24[0xe] = auVar7[0xf];
      auVar24[0xf] = puVar1[0xf];
      auVar7[1] = '@' - auVar25[8];
      auVar7[0] = auVar25[8];
      auVar7[2] = auVar25[9];
      auVar7[3] = '@' - auVar25[9];
      auVar7[4] = auVar25[10];
      auVar7[5] = '@' - auVar25[10];
      auVar7[6] = auVar25[0xb];
      auVar7[7] = '@' - auVar25[0xb];
      auVar7[8] = auVar25[0xc];
      auVar7[9] = '@' - auVar25[0xc];
      auVar7[10] = auVar25[0xd];
      auVar7[0xb] = '@' - auVar25[0xd];
      auVar7[0xc] = auVar25[0xe];
      auVar7[0xd] = '@' - auVar25[0xe];
      auVar7[0xe] = auVar25[0xf];
      auVar7[0xf] = '@' - auVar25[0xf];
      auVar7 = pmaddubsw(auVar24,auVar7);
      sVar6 = pavgw(auVar7._0_2_ >> 5,0);
      sVar8 = pavgw(auVar7._2_2_ >> 5,0);
      sVar9 = pavgw(auVar7._4_2_ >> 5,0);
      sVar10 = pavgw(auVar7._6_2_ >> 5,0);
      sVar11 = pavgw(auVar7._8_2_ >> 5,0);
      sVar12 = pavgw(auVar7._10_2_ >> 5,0);
      sVar13 = pavgw(auVar7._12_2_ >> 5,0);
      sVar14 = pavgw(auVar7._14_2_ >> 5,0);
      auVar25[1] = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26);
      auVar25[0] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
      auVar25[2] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
      auVar25[3] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
      auVar25[4] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
      auVar25[5] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
      auVar25[6] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
      auVar25[7] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
      auVar25[8] = (0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6);
      auVar25[9] = (0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8);
      auVar25[10] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
      auVar25[0xb] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
      auVar25[0xc] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
      auVar25[0xd] = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
      auVar25[0xe] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
      auVar25[0xf] = (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14);
      auVar7 = psadbw(auVar25,*(undefined1 (*) [16])(src_ptr + lVar3));
      iVar4 = iVar4 + auVar7._0_4_;
      iVar5 = iVar5 + auVar7._8_4_;
    }
    src_ptr = src_ptr + src_stride;
    a_ptr = a_ptr + a_stride;
    b_ptr = b_ptr + b_stride;
    m_ptr = m_ptr + m_stride;
  }
  return iVar5 + iVar4;
}

Assistant:

static inline unsigned int masked_sad_ssse3(const uint8_t *src_ptr,
                                            int src_stride,
                                            const uint8_t *a_ptr, int a_stride,
                                            const uint8_t *b_ptr, int b_stride,
                                            const uint8_t *m_ptr, int m_stride,
                                            int width, int height) {
  int x, y;
  __m128i res = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 16) {
      const __m128i src = _mm_loadu_si128((const __m128i *)&src_ptr[x]);
      const __m128i a = _mm_loadu_si128((const __m128i *)&a_ptr[x]);
      const __m128i b = _mm_loadu_si128((const __m128i *)&b_ptr[x]);
      const __m128i m = _mm_loadu_si128((const __m128i *)&m_ptr[x]);
      const __m128i m_inv = _mm_sub_epi8(mask_max, m);

      // Calculate 16 predicted pixels.
      // Note that the maximum value of any entry of 'pred_l' or 'pred_r'
      // is 64 * 255, so we have plenty of space to add rounding constants.
      const __m128i data_l = _mm_unpacklo_epi8(a, b);
      const __m128i mask_l = _mm_unpacklo_epi8(m, m_inv);
      __m128i pred_l = _mm_maddubs_epi16(data_l, mask_l);
      pred_l = xx_roundn_epu16(pred_l, AOM_BLEND_A64_ROUND_BITS);

      const __m128i data_r = _mm_unpackhi_epi8(a, b);
      const __m128i mask_r = _mm_unpackhi_epi8(m, m_inv);
      __m128i pred_r = _mm_maddubs_epi16(data_r, mask_r);
      pred_r = xx_roundn_epu16(pred_r, AOM_BLEND_A64_ROUND_BITS);

      const __m128i pred = _mm_packus_epi16(pred_l, pred_r);
      res = _mm_add_epi32(res, _mm_sad_epu8(pred, src));
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // At this point, we have two 32-bit partial SADs in lanes 0 and 2 of 'res'.
  unsigned int sad = (unsigned int)(_mm_cvtsi128_si32(res) +
                                    _mm_cvtsi128_si32(_mm_srli_si128(res, 8)));
  return sad;
}